

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
despot::Function::SetValue
          (Function *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,int key_pos,int pid,int cid,vector<double,_std::allocator<double>_> *values,
          int start,int end)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference this_00;
  reference pvVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  long lVar9;
  reference ppNVar10;
  reference pvVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ulong uVar13;
  ostream *poVar14;
  string *psVar15;
  value_type local_c8;
  string local_88;
  int local_68;
  int local_64;
  int id;
  int next_pid_1;
  int next_cid_1;
  int i_1;
  int block_size;
  int next_pid;
  int next_cid;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dom;
  NamedVar *curr;
  vector<double,_std::allocator<double>_> *values_local;
  int local_28;
  int cid_local;
  int pid_local;
  int key_pos_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  Function *this_local;
  
  curr = (NamedVar *)values;
  values_local._4_4_ = cid;
  local_28 = pid;
  cid_local = key_pos;
  _pid_local = keys;
  keys_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size
                    (&this->parents_);
  if ((long)key_pos == sVar4 + 1) {
    if (start != end + -1) {
      __assert_fail("start == end - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                    ,0x26,
                    "bool despot::Function::SetValue(vector<string> &, int, int, int, const vector<double> &, int, int)"
                   );
    }
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->values_);
    if (sVar4 == 0) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)curr,(long)start);
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)curr,(long)start);
        vVar1 = *pvVar5;
        pvVar8 = std::
                 vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ::operator[](&this->map_,(long)local_28);
        pmVar7 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](pvVar8,(key_type_conflict *)((long)&values_local + 4));
        *pmVar7 = vVar1;
      }
      else {
        pvVar8 = std::
                 vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ::operator[](&this->map_,(long)local_28);
        std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::erase
                  (pvVar8,(key_type_conflict *)((long)&values_local + 4));
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)curr,(long)start);
      vVar1 = *pvVar5;
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->values_,(long)local_28);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)values_local._4_4_);
      *pvVar6 = vVar1;
    }
    this_local._7_1_ = true;
  }
  else {
    lVar9 = (long)cid_local;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(_pid_local);
    if (lVar9 == sVar4 - 1) {
      local_c8 = this->child_;
    }
    else {
      ppNVar10 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                           (&this->parents_,(long)cid_local);
      local_c8 = *ppNVar10;
    }
    dom = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_c8;
    _next_cid = Variable::values_abi_cxx11_(&local_c8->super_Variable);
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](_pid_local,(long)cid_local);
    bVar2 = std::operator==(pvVar11,"*");
    if (bVar2) {
      for (next_pid = 0; uVar13 = (ulong)next_pid,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(_next_cid), uVar13 < sVar4; next_pid = next_pid + 1) {
        block_size = values_local._4_4_;
        i_1 = local_28;
        lVar9 = (long)cid_local;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(_pid_local);
        iVar3 = local_28;
        if (lVar9 == sVar4 - 1) {
          block_size = next_pid;
        }
        else {
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(_next_cid);
          i_1 = iVar3 * (int)sVar4 + next_pid;
        }
        bVar2 = SetValue(this,_pid_local,cid_local + 1,i_1,block_size,
                         (vector<double,_std::allocator<double>_> *)curr,start,end);
        if (!bVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](_pid_local,(long)cid_local);
      bVar2 = std::operator==(pvVar11,"-");
      pvVar12 = dom;
      if (bVar2) {
        pvVar12 = Variable::values_abi_cxx11_((Variable *)dom);
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar12);
        next_cid_1 = (int)((ulong)(long)(end - start) / sVar4);
        for (next_pid_1 = 0; uVar13 = (ulong)next_pid_1,
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(_next_cid), uVar13 < sVar4; next_pid_1 = next_pid_1 + 1) {
          id = values_local._4_4_;
          local_64 = local_28;
          lVar9 = (long)cid_local;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(_pid_local);
          iVar3 = local_28;
          if (lVar9 == sVar4 - 1) {
            id = next_pid_1;
          }
          else {
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(_next_cid);
            local_64 = iVar3 * (int)sVar4 + next_pid_1;
          }
          bVar2 = SetValue(this,_pid_local,cid_local + 1,local_64,id,
                           (vector<double,_std::allocator<double>_> *)curr,
                           start + next_pid_1 * next_cid_1,start + (next_pid_1 + 1) * next_cid_1);
          if (!bVar2) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](_pid_local,(long)cid_local);
        std::__cxx11::string::string((string *)&local_88,(string *)pvVar11);
        iVar3 = Variable::IndexOf((Variable *)pvVar12,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        local_68 = iVar3;
        if (iVar3 < 0) {
          poVar14 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](_pid_local,(long)cid_local);
          poVar14 = std::operator<<(poVar14,(string *)pvVar11);
          poVar14 = std::operator<<(poVar14," is not in the domain of ");
          psVar15 = NamedVar::name_abi_cxx11_((NamedVar *)dom);
          poVar14 = std::operator<<(poVar14,(string *)psVar15);
          std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
        }
        else {
          lVar9 = (long)cid_local;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(_pid_local);
          iVar3 = local_28;
          if (lVar9 == sVar4 - 1) {
            values_local._4_4_ = local_68;
          }
          else {
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(_next_cid);
            local_28 = iVar3 * (int)sVar4 + local_68;
          }
          this_local._7_1_ =
               SetValue(this,_pid_local,cid_local + 1,local_28,values_local._4_4_,
                        (vector<double,_std::allocator<double>_> *)curr,start,end);
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Function::SetValue(vector<string>& keys, int key_pos, int pid, int cid,
	const vector<double>& values, int start, int end) {
	if (key_pos == parents_.size() + 1) {
		assert(start == end - 1);

		if (values_.size() > 0) // TODO: possible refactoring to use a single data structure
			values_[pid][cid] = values[start];
		else {
			if (values[start] != 0.0) {
				map_[pid][cid] = values[start];
			} else {
				map_[pid].erase(cid);
			}
		}

		return true;
	} else {
		NamedVar* curr =
			(key_pos == keys.size() - 1) ? child_ : parents_[key_pos];
		const vector<string>& dom = curr->values();

		if (keys[key_pos] == "*") {
			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start, end))
					return false;
			}
			return true;
		} else if (keys[key_pos] == "-") {
			int block_size = (end - start) / curr->values().size();

			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start + i * block_size, start + (i + 1) * block_size))
					return false;
			}
			return true;
		} else {
			int id = curr->IndexOf(keys[key_pos]);
			if (id < 0) {
				cerr << "ERROR: " << keys[key_pos]
					<< " is not in the domain of " << curr->name() << endl;
				return false;
			}

			if (key_pos == keys.size() - 1)
				cid = id;
			else
				pid = pid * dom.size() + id;

			return SetValue(keys, key_pos + 1, pid, cid, values, start, end);
		}
	}
}